

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

void __thiscall
jbcoin::STObject::set
          (STObject *this,unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_> *v)

{
  bool bVar1;
  pointer this_00;
  SField *field;
  type pSVar2;
  reference this_01;
  STVar local_88;
  int local_1c;
  unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_> *puStack_18;
  int i;
  unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_> *v_local;
  STObject *this_local;
  
  puStack_18 = v;
  v_local = (unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_> *)this;
  this_00 = std::unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_>::operator->(v);
  field = STBase::getFName(this_00);
  local_1c = getFieldIndex(this,field);
  if (local_1c == -1) {
    bVar1 = isFree(this);
    if (!bVar1) {
      Throw<std::runtime_error,char_const(&)[36]>
                ((char (*) [36])"missing field in templated STObject");
    }
    pSVar2 = std::unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_>::operator*(v);
    std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::
    emplace_back<jbcoin::STBase>(&this->v_,pSVar2);
  }
  else {
    pSVar2 = std::unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_>::operator*(v);
    jbcoin::detail::STVar::STVar(&local_88,pSVar2);
    this_01 = std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::operator[]
                        (&this->v_,(long)local_1c);
    jbcoin::detail::STVar::operator=(this_01,&local_88);
    jbcoin::detail::STVar::~STVar(&local_88);
  }
  return;
}

Assistant:

void
STObject::set (std::unique_ptr<STBase> v)
{
    auto const i =
        getFieldIndex(v->getFName());
    if (i != -1)
    {
        v_[i] = std::move(*v);
    }
    else
    {
        if (! isFree())
            Throw<std::runtime_error> (
                "missing field in templated STObject");
        v_.emplace_back(std::move(*v));
    }
}